

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Own<kj::NetworkAddress,_std::nullptr_t> __thiscall
kj::anon_unknown_0::SocketNetwork::getSockaddr(SocketNetwork *this,void *sockaddr,uint len)

{
  _func_int **pp_Var1;
  Exception *__dest;
  LowLevelAsyncIoProvider *pLVar2;
  uint in_ECX;
  undefined4 in_register_00000014;
  NetworkAddress *extraout_RDX;
  Own<kj::NetworkAddress,_std::nullptr_t> OVar3;
  DebugExpression<bool> _kjCondition;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> array;
  Fault f;
  
  __dest = (Exception *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  SocketAddress::SocketAddress
            ((SocketAddress *)&f,(void *)CONCAT44(in_register_00000014,len),in_ECX);
  memcpy(__dest,&f,0x88);
  _kjCondition.value =
       (bool)(*(code *)**(undefined8 **)((long)sockaddr + 0x10))
                       ((_func_int **)((long)sockaddr + 0x10),&(__dest->ownFile).content.size_,
                        *(undefined4 *)&(__dest->ownFile).content.ptr);
  if (_kjCondition.value == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x6d5,FAILED,"array[0].allowedBy(filter)",
               "_kjCondition,\"address blocked by restrictPeers()\"",&_kjCondition,
               (char (*) [35])"address blocked by restrictPeers()");
    kj::_::Debug::Fault::~Fault(&f);
  }
  pp_Var1 = *(_func_int ***)((long)sockaddr + 8);
  f.exception = __dest;
  pLVar2 = (LowLevelAsyncIoProvider *)operator_new(0x38);
  pLVar2->_vptr_LowLevelAsyncIoProvider = (_func_int **)&PTR_connect_006e1b90;
  pLVar2[1]._vptr_LowLevelAsyncIoProvider = pp_Var1;
  pLVar2[2]._vptr_LowLevelAsyncIoProvider = (_func_int **)((long)sockaddr + 0x10);
  pLVar2[3]._vptr_LowLevelAsyncIoProvider = (_func_int **)__dest;
  pLVar2[4]._vptr_LowLevelAsyncIoProvider = (_func_int **)0x1;
  pLVar2[5]._vptr_LowLevelAsyncIoProvider = (_func_int **)&kj::_::HeapArrayDisposer::instance;
  *(undefined4 *)&pLVar2[6]._vptr_LowLevelAsyncIoProvider = 0;
  (this->super_Network)._vptr_Network =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressImpl>::instance;
  this->lowLevel = pLVar2;
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<NetworkAddress> getSockaddr(const void* sockaddr, uint len) override {
    auto array = kj::heapArrayBuilder<SocketAddress>(1);
    array.add(SocketAddress(sockaddr, len));
    KJ_REQUIRE(array[0].allowedBy(filter), "address blocked by restrictPeers()") { break; }
    return Own<NetworkAddress>(heap<NetworkAddressImpl>(lowLevel, filter, array.finish()));
  }